

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2cSimulationDataGenerator.cpp
# Opt level: O2

void __thiscall
I2cSimulationDataGenerator::Initialize
          (I2cSimulationDataGenerator *this,U32 simulation_sample_rate,I2cAnalyzerSettings *settings
          )

{
  SimulationChannelDescriptorGroup *pSVar1;
  SimulationChannelDescriptor *pSVar2;
  
  this->mSimulationSampleRateHz = simulation_sample_rate;
  this->mSettings = settings;
  ClockGenerator::Init(400000.0,(int)this + 0x10);
  pSVar1 = &this->mI2cSimulationChannels;
  pSVar2 = (SimulationChannelDescriptor *)
           SimulationChannelDescriptorGroup::Add
                     ((Channel *)pSVar1,(int)settings + 0x10,this->mSimulationSampleRateHz);
  this->mSda = pSVar2;
  pSVar2 = (SimulationChannelDescriptor *)
           SimulationChannelDescriptorGroup::Add
                     ((Channel *)pSVar1,(int)settings + 0x20,this->mSimulationSampleRateHz);
  this->mScl = pSVar2;
  ClockGenerator::AdvanceByHalfPeriod(10.0);
  SimulationChannelDescriptorGroup::AdvanceAll((uint)pSVar1);
  this->mValue = '\0';
  return;
}

Assistant:

void I2cSimulationDataGenerator::Initialize( U32 simulation_sample_rate, I2cAnalyzerSettings* settings )
{
    mSimulationSampleRateHz = simulation_sample_rate;
    mSettings = settings;

    mClockGenerator.Init( 400000, simulation_sample_rate );

    mSda = mI2cSimulationChannels.Add( settings->mSdaChannel, mSimulationSampleRateHz, BIT_HIGH );
    mScl = mI2cSimulationChannels.Add( settings->mSclChannel, mSimulationSampleRateHz, BIT_HIGH );

    mI2cSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

    mValue = 0;
}